

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::anon_unknown_0::ReportReflectionUsageTypeError
               (Descriptor *descriptor,FieldDescriptor *field,char *method,CppType expected_type)

{
  LogMessage *pLVar1;
  _func_void_FieldDescriptor_ptr *local_70;
  FieldDescriptor *local_68;
  LogMessage local_60;
  
  internal::LogMessage::LogMessage
            (&local_60,LOGLEVEL_FATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0x90);
  pLVar1 = internal::LogMessage::operator<<
                     (&local_60,
                      "Protocol Buffer reflection usage error:\n  Method      : google::protobuf::Reflection::"
                     );
  pLVar1 = internal::LogMessage::operator<<(pLVar1,method);
  pLVar1 = internal::LogMessage::operator<<(pLVar1,"\n  Message type: ");
  pLVar1 = internal::LogMessage::operator<<(pLVar1,*(string **)(descriptor + 8));
  pLVar1 = internal::LogMessage::operator<<(pLVar1,"\n  Field       : ");
  pLVar1 = internal::LogMessage::operator<<(pLVar1,*(string **)(field + 8));
  pLVar1 = internal::LogMessage::operator<<
                     (pLVar1,
                      "\n  Problem     : Field is not the right type for this message:\n    Expected  : "
                     );
  pLVar1 = internal::LogMessage::operator<<
                     (pLVar1,*(char **)((anonymous_namespace)::cpptype_names_ +
                                       (ulong)expected_type * 8));
  pLVar1 = internal::LogMessage::operator<<(pLVar1,"\n    Field type: ");
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_70 = FieldDescriptor::TypeOnceInit;
    local_68 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_70,&local_68);
  }
  pLVar1 = internal::LogMessage::operator<<
                     (pLVar1,*(char **)((anonymous_namespace)::cpptype_names_ +
                                       (ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap +
                                                       (ulong)*(uint *)(field + 0x38) * 4) * 8));
  internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar1);
  internal::LogMessage::~LogMessage(&local_60);
  return;
}

Assistant:

static void ReportReflectionUsageTypeError(
    const Descriptor* descriptor, const FieldDescriptor* field,
    const char* method, FieldDescriptor::CppType expected_type) {
  GOOGLE_LOG(FATAL)
      << "Protocol Buffer reflection usage error:\n"
         "  Method      : google::protobuf::Reflection::"
      << method
      << "\n"
         "  Message type: "
      << descriptor->full_name()
      << "\n"
         "  Field       : "
      << field->full_name()
      << "\n"
         "  Problem     : Field is not the right type for this message:\n"
         "    Expected  : "
      << cpptype_names_[expected_type]
      << "\n"
         "    Field type: "
      << cpptype_names_[field->cpp_type()];
}